

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

Vector3d * __thiscall
VCClusterAniso::center
          (Vector3d *__return_storage_ptr__,VCClusterAniso *this,Matrix3d *sumK,Vector3d *sumKPos)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  bool valid;
  double det;
  Matrix3d sumKInv;
  bool local_99;
  Scalar local_98;
  Matrix<double,_3,_3,_0,_3,_3> *local_90;
  Vector3d *local_88;
  Matrix<double,_3,_3,_0,_3,_3> local_68;
  
  local_90 = (Matrix<double,_3,_3,_0,_3,_3> *)0x3d719799812dea11;
  Eigen::internal::
  compute_inverse_and_det_with_check<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>
  ::run(sumK,(RealScalar *)&local_90,&local_68,&local_98,&local_99);
  if (local_99 == false) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = 0.0;
  }
  else {
    local_90 = &local_68;
    local_88 = sumKPos;
    other = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            Eigen::CoeffBasedProduct::operator_cast_to_Matrix_((CoeffBasedProduct *)&local_90);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::Matrix<double,3,1,0,3,1>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d VCClusterAniso::center(const Matrix3d& sumK, const Vector3d &sumKPos)
{
	bool valid;
	Matrix3d sumKInv;
	double det;
	sumK.computeInverseAndDetWithCheck(sumKInv, det, valid);
	if (!valid) {
		return Vector3d(0, 0, 0);
	}
	return sumKInv * sumKPos;
}